

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

void DumpLiterals(OutputStream *stream,SQObjectPtr *_literals,SQInt32 _nliterals)

{
  ulong uVar1;
  
  streamprintf(stream,"-----LITERALS\n");
  if (0 < _nliterals) {
    uVar1 = 0;
    do {
      streamprintf(stream,"[%d] ",uVar1 & 0xffffffff);
      DumpLiteral(stream,_literals);
      streamprintf(stream,"\n");
      uVar1 = uVar1 + 1;
      _literals = _literals + 1;
    } while ((uint)_nliterals != uVar1);
  }
  return;
}

Assistant:

void DumpLiterals(OutputStream *stream, const SQObjectPtr *_literals, SQInt32 _nliterals)
{
    streamprintf(stream, _SC("-----LITERALS\n"));
    for (SQInt32 i = 0; i < _nliterals; ++i) {
        streamprintf(stream, _SC("[%d] "), (SQInt32)i);
        DumpLiteral(stream, _literals[i]);
        streamprintf(stream, _SC("\n"));
    }
}